

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall
ManifestParser::Parse(ManifestParser *this,string *filename,string *input,string *err)

{
  Lexer *this_00;
  StringPiece input_00;
  StringPiece filename_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  Token t;
  int iVar4;
  long *plVar5;
  ulong *puVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  byte unaff_R13B;
  string name;
  string value;
  EvalString let_value;
  string local_88;
  string local_68;
  EvalString local_48;
  
  this_00 = &(this->super_Parser).lexer_;
  filename_00.str_ = (filename->_M_dataplus)._M_p;
  filename_00.len_ = filename->_M_string_length;
  input_00.str_ = (input->_M_dataplus)._M_p;
  input_00.len_ = input->_M_string_length;
  Lexer::Start(this_00,filename_00,input_00);
  do {
    t = Lexer::ReadToken(this_00);
    bVar3 = unaff_R13B;
    switch(t) {
    case ERROR:
      Lexer::DescribeLastError_abi_cxx11_(&local_88,this_00);
      bVar3 = Lexer::Error(this_00,&local_88,err);
      uVar7 = local_88.field_2._M_allocated_capacity;
      _Var8._M_p = local_88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_001173cb:
        operator_delete(_Var8._M_p,uVar7 + 1);
      }
      goto LAB_001173d3;
    case BUILD:
      bVar2 = ParseEdge(this,err);
      break;
    default:
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unexpected ","");
      Lexer::TokenName(t);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
      puVar6 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_88.field_2._M_allocated_capacity = *puVar6;
        local_88.field_2._8_8_ = plVar5[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *puVar6;
        local_88._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_88._M_string_length = plVar5[1];
      *plVar5 = (long)puVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bVar3 = Lexer::Error(this_00,&local_88,err);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      uVar7 = local_68.field_2._M_allocated_capacity;
      _Var8._M_p = local_68._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_001173cb;
      goto LAB_001173d3;
    case DEFAULT:
      bVar2 = ParseDefault(this,err);
      break;
    case IDENT:
      Lexer::UnreadToken(this_00);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity =
           local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_48.parsed_.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.parsed_.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.parsed_.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar2 = ParseLet(this,&local_88,&local_48,err);
      if (bVar2) {
        EvalString::Evaluate_abi_cxx11_(&local_68,&local_48,&this->env_->super_Env);
        iVar4 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar4 == 0) {
          CheckNinjaVersion(&local_68);
        }
        BindingEnv::AddBinding(this->env_,&local_88,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar3 = 0;
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector(&local_48.parsed_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) goto switchD_00117161_caseD_8;
      goto LAB_001173d3;
    case INCLUDE:
      bVar2 = false;
      bVar1 = ParseFileInclude(this,false,err);
      bVar3 = 0;
      if (bVar1) goto LAB_00117363;
      goto LAB_001173d5;
    case NEWLINE:
switchD_00117161_caseD_8:
      unaff_R13B = bVar3;
      goto LAB_00117363;
    case POOL:
      bVar2 = ParsePool(this,err);
      break;
    case RULE:
      bVar2 = ParseRule(this,err);
      break;
    case SUBNINJA:
      bVar2 = ParseFileInclude(this,true,err);
      break;
    case TEOF:
      bVar3 = 1;
      goto LAB_001173d3;
    }
    if (bVar2 == false) {
      bVar3 = 0;
LAB_001173d3:
      bVar2 = false;
    }
    else {
LAB_00117363:
      bVar3 = unaff_R13B;
      bVar2 = true;
    }
LAB_001173d5:
    unaff_R13B = bVar3;
    if (!bVar2) {
      return (bool)(bVar3 & 1);
    }
  } while( true );
}

Assistant:

bool ManifestParser::Parse(const string& filename, const string& input,
                           string* err) {
  lexer_.Start(filename, input);

  for (;;) {
    Lexer::Token token = lexer_.ReadToken();
    switch (token) {
    case Lexer::POOL:
      if (!ParsePool(err))
        return false;
      break;
    case Lexer::BUILD:
      if (!ParseEdge(err))
        return false;
      break;
    case Lexer::RULE:
      if (!ParseRule(err))
        return false;
      break;
    case Lexer::DEFAULT:
      if (!ParseDefault(err))
        return false;
      break;
    case Lexer::IDENT: {
      lexer_.UnreadToken();
      string name;
      EvalString let_value;
      if (!ParseLet(&name, &let_value, err))
        return false;
      string value = let_value.Evaluate(env_);
      // Check ninja_required_version immediately so we can exit
      // before encountering any syntactic surprises.
      if (name == "ninja_required_version")
        CheckNinjaVersion(value);
      env_->AddBinding(name, value);
      break;
    }
    case Lexer::INCLUDE:
      if (!ParseFileInclude(false, err))
        return false;
      break;
    case Lexer::SUBNINJA:
      if (!ParseFileInclude(true, err))
        return false;
      break;
    case Lexer::ERROR: {
      return lexer_.Error(lexer_.DescribeLastError(), err);
    }
    case Lexer::TEOF:
      return true;
    case Lexer::NEWLINE:
      break;
    default:
      return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                          err);
    }
  }
  return false;  // not reached
}